

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_TypeRules.h
# Opt level: O0

ArraySize soul::TypeRules::checkArraySizeAndThrowErrorIfIllegal<soul::AST::Context&,long>
                    (Context *errorContext,long size)

{
  long this;
  bool bVar1;
  CompileMessage local_50;
  ArraySize local_18;
  long size_local;
  Context *errorContext_local;
  
  local_18 = size;
  size_local = (long)errorContext;
  bVar1 = Type::canBeSafelyCastToArraySize(size);
  this = size_local;
  if (!bVar1) {
    if ((long)local_18 < 1) {
      Errors::illegalArraySize<>();
    }
    else {
      Errors::tooManyElements<>();
    }
    AST::Context::throwError((Context *)this,&local_50,false);
  }
  return local_18;
}

Assistant:

static Type::ArraySize checkArraySizeAndThrowErrorIfIllegal (Thrower&& errorContext, SizeType size)
    {
        if (! Type::canBeSafelyCastToArraySize ((int64_t) size))
            errorContext.throwError (size > 0 ? Errors::tooManyElements()
                                              : Errors::illegalArraySize());

        return static_cast<Type::ArraySize> (size);
    }